

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall MlmWrap::subscribeEvent(MlmWrap *this,string *origin,string *event)

{
  int iVar1;
  string evt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"_evt.",event);
  iVar1 = subscribeStream(this,(origin->_M_dataplus)._M_p,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

int MlmWrap::subscribeEvent(const std::string &origin, const std::string &event){
    std::string evt = eventprefix + event;
    return subscribeStream(origin.c_str(), evt.c_str());
}